

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_repair(REF_GRID ref_grid)

{
  REF_INT *pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  long lVar4;
  undefined8 local_248;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 local_218;
  bool local_1f6;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_INT pyr_nodes [27];
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_INT tri_face;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_INT new_cell;
  REF_BOOL split_face;
  REF_INT face_nodes [4];
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_118;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_INT cell_node;
  REF_INT new_node;
  REF_GLOB global;
  REF_INT hex_nodes [27];
  uint local_94;
  REF_INT cell1;
  REF_INT cell0;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS code;
  REF_BOOL report;
  REF_INT nodes [4];
  int local_50;
  REF_INT node;
  REF_INT cell_face;
  REF_INT cell;
  REF_INT group;
  REF_INT face;
  REF_INT *hits;
  REF_CELL ref_cell;
  REF_FACE ref_face;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_face = (REF_FACE)ref_grid->node;
  ref_node = (REF_NODE)ref_grid;
  ref_private_macro_code_rss_2 = ref_face_create((REF_FACE *)&ref_cell,ref_grid);
  if (ref_private_macro_code_rss_2 == 0) {
    if ((int)ref_cell->type < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x229,"ref_validation_repair","malloc hits of REF_INT negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      _group = malloc((long)(int)ref_cell->type << 2);
      if (_group == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x229,"ref_validation_repair","malloc hits of REF_INT NULL");
        ref_grid_local._4_4_ = 2;
      }
      else {
        for (cell = 0; cell < (int)ref_cell->type; cell = cell + 1) {
          *(undefined4 *)((long)_group + (long)cell * 4) = 0;
        }
        cell_face = 8;
        hits = &ref_node->ref_mpi->n;
        while (cell_face < 0x10) {
          for (node = 0; node < hits[0xb]; node = node + 1) {
            if (((-1 < node) && (node < hits[0xb])) &&
               (*(int *)(*(long *)(hits + 0xe) + (long)(hits[2] * node) * 4) != -1)) {
              for (local_50 = 0; local_50 < hits[5]; local_50 = local_50 + 1) {
                for (nodes[3] = 0; nodes[3] < 4; nodes[3] = nodes[3] + 1) {
                  (&code)[nodes[3]] =
                       *(REF_STATUS *)
                        (*(long *)(hits + 0xe) +
                        (long)(*(int *)(*(long *)(hits + 8) + (long)(nodes[3] + local_50 * 4) * 4) +
                              hits[2] * node) * 4);
                }
                ref_private_macro_code_rss_3 = ref_face_with((REF_FACE)ref_cell,&code,&cell);
                if (ref_private_macro_code_rss_3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                         ,0x233,"ref_validation_repair",(ulong)(uint)ref_private_macro_code_rss_3,
                         "find cell face");
                  return ref_private_macro_code_rss_3;
                }
                *(int *)((long)_group + (long)cell * 4) =
                     *(int *)((long)_group + (long)cell * 4) + 1;
                ref_private_macro_code_rss_3 = 0;
              }
            }
          }
          cell_face = cell_face + 1;
          hits = (REF_INT *)(&ref_node->global)[cell_face];
        }
        hits = ref_node->part;
        for (node = 0; node < hits[0xb]; node = node + 1) {
          if (((-1 < node) && (node < hits[0xb])) &&
             (*(int *)(*(long *)(hits + 0xe) + (long)(hits[2] * node) * 4) != -1)) {
            for (nodes[3] = 0; nodes[3] < 3; nodes[3] = nodes[3] + 1) {
              (&code)[nodes[3]] =
                   *(REF_STATUS *)(*(long *)(hits + 0xe) + (long)(nodes[3] + hits[2] * node) * 4);
            }
            nodes[1] = code;
            ref_private_macro_code_rss_1 = ref_face_with((REF_FACE)ref_cell,&code,&cell);
            if (ref_private_macro_code_rss_1 != 0) {
              ref_node_location(*(REF_NODE *)&ref_node->blank,code);
              ref_node_location(*(REF_NODE *)&ref_node->blank,report);
              ref_node_location(*(REF_NODE *)&ref_node->blank,nodes[0]);
              ref_node_location(*(REF_NODE *)&ref_node->blank,nodes[1]);
            }
            ref_private_macro_code_rss_4 = ref_private_macro_code_rss_1;
            if (ref_private_macro_code_rss_1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x246,"ref_validation_repair",(ulong)(uint)ref_private_macro_code_rss_1,
                     "find tri");
              return ref_private_macro_code_rss_4;
            }
            *(int *)((long)_group + (long)cell * 4) = *(int *)((long)_group + (long)cell * 4) + 1;
          }
        }
        hits = *(REF_INT **)&ref_node->naux;
        for (node = 0; node < hits[0xb]; node = node + 1) {
          if (((-1 < node) && (node < hits[0xb])) &&
             (*(int *)(*(long *)(hits + 0xe) + (long)(hits[2] * node) * 4) != -1)) {
            for (nodes[3] = 0; nodes[3] < 4; nodes[3] = nodes[3] + 1) {
              (&code)[nodes[3]] =
                   *(REF_STATUS *)(*(long *)(hits + 0xe) + (long)(nodes[3] + hits[2] * node) * 4);
            }
            ref_private_macro_code_rss_5 = ref_face_with((REF_FACE)ref_cell,&code,&cell);
            if (ref_private_macro_code_rss_5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x24f,"ref_validation_repair",(ulong)(uint)ref_private_macro_code_rss_5,
                     "find qua");
              return ref_private_macro_code_rss_5;
            }
            *(int *)((long)_group + (long)cell * 4) = *(int *)((long)_group + (long)cell * 4) + 1;
            ref_private_macro_code_rss_5 = 0;
          }
        }
        for (cell = 0; cell < (int)ref_cell->type; cell = cell + 1) {
          if (**(int **)ref_node < 2) {
            ref_private_macro_code_rss = (REF_STATUS)(*(int *)((long)_group + (long)cell * 4) != 2);
          }
          else {
            ref_private_macro_code_rss = (REF_STATUS)(2 < *(int *)((long)_group + (long)cell * 4));
            if ((((ref_face[3].f2n[1] ==
                   (&(ref_face[1].adj)->nnode)
                   [*(int *)(*(long *)&ref_cell->size_per + (long)(cell << 2) * 4)]) ||
                 (ref_face[3].f2n[1] ==
                  (&(ref_face[1].adj)->nnode)
                  [*(int *)(*(long *)&ref_cell->size_per + (long)(cell * 4 + 1) * 4)])) ||
                (ref_face[3].f2n[1] ==
                 (&(ref_face[1].adj)->nnode)
                 [*(int *)(*(long *)&ref_cell->size_per + (long)(cell * 4 + 2) * 4)])) ||
               (ref_face[3].f2n[1] ==
                (&(ref_face[1].adj)->nnode)
                [*(int *)(*(long *)&ref_cell->size_per + (long)(cell * 4 + 3) * 4)])) {
              local_1f6 = true;
              if (ref_private_macro_code_rss == 0) {
                local_1f6 = *(int *)((long)_group + (long)cell * 4) < 2;
              }
              ref_private_macro_code_rss = (REF_STATUS)local_1f6;
            }
          }
          if (ref_private_macro_code_rss != 0) {
            printf(" hits %d\n",(ulong)*(uint *)((long)_group + (long)cell * 4));
            for (nodes[3] = 0; nodes[3] < 4; nodes[3] = nodes[3] + 1) {
              (&code)[nodes[3]] =
                   *(REF_STATUS *)(*(long *)&ref_cell->size_per + (long)(nodes[3] + cell * 4) * 4);
            }
            if (((code < 0) || (*(int *)(*(long *)&ref_node->blank + 4) <= code)) ||
               (*(long *)(*(long *)(*(long *)&ref_node->blank + 0x10) + (long)code * 8) < 0)) {
              local_218 = 0xffffffffffffffff;
            }
            else {
              local_218 = *(undefined8 *)
                           (*(long *)(*(long *)&ref_node->blank + 0x10) + (long)code * 8);
            }
            if (((report < 0) || (*(int *)(*(long *)&ref_node->blank + 4) <= report)) ||
               (*(long *)(*(long *)(*(long *)&ref_node->blank + 0x10) + (long)report * 8) < 0)) {
              local_228 = 0xffffffffffffffff;
            }
            else {
              local_228 = *(undefined8 *)
                           (*(long *)(*(long *)&ref_node->blank + 0x10) + (long)report * 8);
            }
            if (((nodes[0] < 0) || (*(int *)(*(long *)&ref_node->blank + 4) <= nodes[0])) ||
               (*(long *)(*(long *)(*(long *)&ref_node->blank + 0x10) + (long)nodes[0] * 8) < 0)) {
              local_238 = 0xffffffffffffffff;
            }
            else {
              local_238 = *(undefined8 *)
                           (*(long *)(*(long *)&ref_node->blank + 0x10) + (long)nodes[0] * 8);
            }
            if (((nodes[1] < 0) || (*(int *)(*(long *)&ref_node->blank + 4) <= nodes[1])) ||
               (*(long *)(*(long *)(*(long *)&ref_node->blank + 0x10) + (long)nodes[1] * 8) < 0)) {
              local_248 = 0xffffffffffffffff;
            }
            else {
              local_248 = *(undefined8 *)
                           (*(long *)(*(long *)&ref_node->blank + 0x10) + (long)nodes[1] * 8);
            }
            printf("face %d nodes %d %d %d %d global %ld %ld %ld %ld\n",(ulong)(uint)cell,
                   (ulong)(uint)code,(ulong)(uint)report,(ulong)(uint)nodes[0],(ulong)(uint)nodes[1]
                   ,local_218,local_228,local_238,local_248);
            ref_private_macro_code_rss_6 = ref_node_location(*(REF_NODE *)&ref_node->blank,code);
            if (ref_private_macro_code_rss_6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x26c,"ref_validation_repair",(ulong)(uint)ref_private_macro_code_rss_6,"n0",
                     local_218,local_228,local_238,local_248);
              return ref_private_macro_code_rss_6;
            }
            ref_private_macro_code_rss_7 = ref_node_location(*(REF_NODE *)&ref_node->blank,report);
            if (ref_private_macro_code_rss_7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x26d,"ref_validation_repair",(ulong)(uint)ref_private_macro_code_rss_7,"n1",
                     local_218,local_228,local_238,local_248);
              return ref_private_macro_code_rss_7;
            }
            cell0 = ref_node_location(*(REF_NODE *)&ref_node->blank,nodes[0]);
            if (cell0 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x26e,"ref_validation_repair",(ulong)(uint)cell0,"n2",local_218,local_228,
                     local_238,local_248);
              return cell0;
            }
            cell1 = ref_node_location(*(REF_NODE *)&ref_node->blank,nodes[1]);
            if (cell1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x26f,"ref_validation_repair",(ulong)(uint)cell1,"n3");
              return cell1;
            }
            if (code != nodes[1]) {
              hits = (REF_INT *)ref_node->old_n_global;
              printf("have quad\n");
              uVar2 = ref_cell_with_face((REF_CELL)hits,&code,(REF_INT *)&local_94,hex_nodes + 0x1a)
              ;
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x277,"ref_validation_repair",(ulong)uVar2,"hex");
                return uVar2;
              }
              printf("hexes %d %d\n",(ulong)local_94,(ulong)(uint)hex_nodes[0x1a]);
              if (local_94 == 0xffffffff) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x279,"ref_validation_repair","cant find hex");
                return 1;
              }
              if ((long)hex_nodes[0x1a] != -1) {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x27a,"ref_validation_repair","found 2 hex",0xffffffffffffffff,
                       (long)hex_nodes[0x1a]);
                return 1;
              }
              uVar2 = ref_cell_nodes((REF_CELL)hits,local_94,(REF_INT *)&global);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x27b,"ref_validation_repair",(ulong)uVar2,"hex");
                return uVar2;
              }
              uVar2 = ref_node_next_global((REF_NODE)ref_face,(REF_GLOB *)&cell_node);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x27c,"ref_validation_repair",(ulong)uVar2,"next global");
                return uVar2;
              }
              uVar2 = ref_node_add((REF_NODE)ref_face,_cell_node,&ref_private_macro_code_rss_8);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x27d,"ref_validation_repair",(ulong)uVar2,"new node");
                return uVar2;
              }
              pRVar1 = ref_face[2].f2n;
              (pRVar1 + (long)(ref_private_macro_code_rss_8 * 0xf) * 2)[0] = 0;
              (pRVar1 + (long)(ref_private_macro_code_rss_8 * 0xf) * 2)[1] = 0;
              pRVar1 = ref_face[2].f2n;
              (pRVar1 + (long)(ref_private_macro_code_rss_8 * 0xf + 1) * 2)[0] = 0;
              (pRVar1 + (long)(ref_private_macro_code_rss_8 * 0xf + 1) * 2)[1] = 0;
              pRVar1 = ref_face[2].f2n;
              (pRVar1 + (long)(ref_private_macro_code_rss_8 * 0xf + 2) * 2)[0] = 0;
              (pRVar1 + (long)(ref_private_macro_code_rss_8 * 0xf + 2) * 2)[1] = 0;
              for (local_118 = 0; local_118 < hits[3]; local_118 = local_118 + 1) {
                *(double *)(ref_face[2].f2n + (long)(ref_private_macro_code_rss_8 * 0xf) * 2) =
                     *(double *)
                      (ref_face[2].f2n + (long)(hex_nodes[(long)local_118 + -2] * 0xf) * 2) +
                     *(double *)(ref_face[2].f2n + (long)(ref_private_macro_code_rss_8 * 0xf) * 2);
                lVar4 = (long)(ref_private_macro_code_rss_8 * 0xf + 1);
                *(double *)(ref_face[2].f2n + lVar4 * 2) =
                     *(double *)
                      (ref_face[2].f2n + (long)(hex_nodes[(long)local_118 + -2] * 0xf + 1) * 2) +
                     *(double *)(ref_face[2].f2n + lVar4 * 2);
                lVar4 = (long)(ref_private_macro_code_rss_8 * 0xf + 2);
                *(double *)(ref_face[2].f2n + lVar4 * 2) =
                     *(double *)
                      (ref_face[2].f2n + (long)(hex_nodes[(long)local_118 + -2] * 0xf + 2) * 2) +
                     *(double *)(ref_face[2].f2n + lVar4 * 2);
              }
              *(double *)(ref_face[2].f2n + (long)(ref_private_macro_code_rss_8 * 0xf) * 2) =
                   *(double *)(ref_face[2].f2n + (long)(ref_private_macro_code_rss_8 * 0xf) * 2) /
                   (double)hits[3];
              lVar4 = (long)(ref_private_macro_code_rss_8 * 0xf + 1);
              *(double *)(ref_face[2].f2n + lVar4 * 2) =
                   *(double *)(ref_face[2].f2n + lVar4 * 2) / (double)hits[3];
              lVar4 = (long)(ref_private_macro_code_rss_8 * 0xf + 2);
              *(double *)(ref_face[2].f2n + lVar4 * 2) =
                   *(double *)(ref_face[2].f2n + lVar4 * 2) / (double)hits[3];
              for (local_50 = 0; local_50 < hits[5]; local_50 = local_50 + 1) {
                new_cell = *(REF_INT *)
                            (*(long *)(hits + 0xe) +
                            (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 << 2) * 4) +
                                       hits[2] * local_94) * 4);
                split_face = *(REF_BOOL *)
                              (*(long *)(hits + 0xe) +
                              (long)(int)(*(int *)(*(long *)(hits + 8) +
                                                  (long)(local_50 * 4 + 1) * 4) + hits[2] * local_94
                                         ) * 4);
                face_nodes[0] =
                     *(REF_INT *)
                      (*(long *)(hits + 0xe) +
                      (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 * 4 + 2) * 4) +
                                 hits[2] * local_94) * 4);
                face_nodes[1] =
                     *(REF_INT *)
                      (*(long *)(hits + 0xe) +
                      (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 * 4 + 3) * 4) +
                                 hits[2] * local_94) * 4);
                ref_private_macro_code_rss_13 =
                     ref_sort_same(4,&code,&new_cell,&ref_private_macro_code_rss_12);
                if (ref_private_macro_code_rss_13 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                         ,0x298,"ref_validation_repair",(ulong)(uint)ref_private_macro_code_rss_13,
                         "same");
                  return ref_private_macro_code_rss_13;
                }
                if (ref_private_macro_code_rss_12 == 0) {
                  ref_private_macro_code_rss_18 =
                       *(REF_STATUS *)
                        (*(long *)(hits + 0xe) +
                        (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 << 2) * 4) +
                                   hits[2] * local_94) * 4);
                  pyr_nodes[1] = *(REF_INT *)
                                  (*(long *)(hits + 0xe) +
                                  (long)(int)(*(int *)(*(long *)(hits + 8) +
                                                      (long)(local_50 * 4 + 1) * 4) +
                                             hits[2] * local_94) * 4);
                  pyr_nodes[2] = *(REF_INT *)
                                  (*(long *)(hits + 0xe) +
                                  (long)(int)(*(int *)(*(long *)(hits + 8) +
                                                      (long)(local_50 * 4 + 2) * 4) +
                                             hits[2] * local_94) * 4);
                  ref_private_macro_code_rss_17 =
                       *(REF_STATUS *)
                        (*(long *)(hits + 0xe) +
                        (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 * 4 + 3) * 4) +
                                   hits[2] * local_94) * 4);
                  pyr_nodes[0] = ref_private_macro_code_rss_8;
                  uVar2 = ref_cell_add(*(REF_CELL *)&ref_node->n_unused,
                                       &ref_private_macro_code_rss_18,&tri_face);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                           ,0x2c7,"ref_validation_repair",(ulong)uVar2,"pyr");
                    return uVar2;
                  }
                }
                else {
                  new_cell = *(REF_INT *)
                              (*(long *)(hits + 0xe) +
                              (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 << 2) * 4)
                                         + hits[2] * local_94) * 4);
                  split_face = *(REF_BOOL *)
                                (*(long *)(hits + 0xe) +
                                (long)(int)(*(int *)(*(long *)(hits + 8) +
                                                    (long)(local_50 * 4 + 1) * 4) +
                                           hits[2] * local_94) * 4);
                  face_nodes[0] =
                       *(REF_INT *)
                        (*(long *)(hits + 0xe) +
                        (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 * 4 + 2) * 4) +
                                   hits[2] * local_94) * 4);
                  face_nodes[1] = new_cell;
                  RVar3 = ref_face_with((REF_FACE)ref_cell,&new_cell,&ref_private_macro_code_rss_14)
                  ;
                  if (RVar3 == 0) {
                    new_cell = *(REF_INT *)
                                (*(long *)(hits + 0xe) +
                                (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 << 2) * 4
                                                    ) + hits[2] * local_94) * 4);
                    split_face = *(REF_BOOL *)
                                  (*(long *)(hits + 0xe) +
                                  (long)(int)(*(int *)(*(long *)(hits + 8) +
                                                      (long)(local_50 * 4 + 1) * 4) +
                                             hits[2] * local_94) * 4);
                    face_nodes[0] =
                         *(REF_INT *)
                          (*(long *)(hits + 0xe) +
                          (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 * 4 + 2) * 4) +
                                     hits[2] * local_94) * 4);
                    face_nodes[1] = ref_private_macro_code_rss_8;
                    uVar2 = ref_cell_add((REF_CELL)ref_node->ref_mpi,&new_cell,&tri_face);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                             ,0x2a5,"ref_validation_repair",(ulong)uVar2,"tet");
                      return uVar2;
                    }
                    new_cell = *(REF_INT *)
                                (*(long *)(hits + 0xe) +
                                (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 << 2) * 4
                                                    ) + hits[2] * local_94) * 4);
                    split_face = *(REF_BOOL *)
                                  (*(long *)(hits + 0xe) +
                                  (long)(int)(*(int *)(*(long *)(hits + 8) +
                                                      (long)(local_50 * 4 + 2) * 4) +
                                             hits[2] * local_94) * 4);
                    face_nodes[0] =
                         *(REF_INT *)
                          (*(long *)(hits + 0xe) +
                          (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 * 4 + 3) * 4) +
                                     hits[2] * local_94) * 4);
                    face_nodes[1] = ref_private_macro_code_rss_8;
                    uVar2 = ref_cell_add((REF_CELL)ref_node->ref_mpi,&new_cell,&tri_face);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                             ,0x2ab,"ref_validation_repair",(ulong)uVar2,"tet");
                      return uVar2;
                    }
                  }
                  new_cell = *(REF_INT *)
                              (*(long *)(hits + 0xe) +
                              (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 << 2) * 4)
                                         + hits[2] * local_94) * 4);
                  split_face = *(REF_BOOL *)
                                (*(long *)(hits + 0xe) +
                                (long)(int)(*(int *)(*(long *)(hits + 8) +
                                                    (long)(local_50 * 4 + 1) * 4) +
                                           hits[2] * local_94) * 4);
                  face_nodes[0] =
                       *(REF_INT *)
                        (*(long *)(hits + 0xe) +
                        (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 * 4 + 3) * 4) +
                                   hits[2] * local_94) * 4);
                  face_nodes[1] = new_cell;
                  RVar3 = ref_face_with((REF_FACE)ref_cell,&new_cell,&ref_private_macro_code_rss_14)
                  ;
                  if (RVar3 == 0) {
                    new_cell = *(REF_INT *)
                                (*(long *)(hits + 0xe) +
                                (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 << 2) * 4
                                                    ) + hits[2] * local_94) * 4);
                    split_face = *(REF_BOOL *)
                                  (*(long *)(hits + 0xe) +
                                  (long)(int)(*(int *)(*(long *)(hits + 8) +
                                                      (long)(local_50 * 4 + 1) * 4) +
                                             hits[2] * local_94) * 4);
                    face_nodes[0] =
                         *(REF_INT *)
                          (*(long *)(hits + 0xe) +
                          (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 * 4 + 3) * 4) +
                                     hits[2] * local_94) * 4);
                    face_nodes[1] = ref_private_macro_code_rss_8;
                    uVar2 = ref_cell_add((REF_CELL)ref_node->ref_mpi,&new_cell,&tri_face);
                    if (uVar2 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                             ,0x2b7,"ref_validation_repair",(ulong)uVar2,"tet");
                      return uVar2;
                    }
                    new_cell = *(REF_INT *)
                                (*(long *)(hits + 0xe) +
                                (long)(int)(*(int *)(*(long *)(hits + 8) +
                                                    (long)(local_50 * 4 + 1) * 4) +
                                           hits[2] * local_94) * 4);
                    split_face = *(REF_BOOL *)
                                  (*(long *)(hits + 0xe) +
                                  (long)(int)(*(int *)(*(long *)(hits + 8) +
                                                      (long)(local_50 * 4 + 2) * 4) +
                                             hits[2] * local_94) * 4);
                    face_nodes[0] =
                         *(REF_INT *)
                          (*(long *)(hits + 0xe) +
                          (long)(int)(*(int *)(*(long *)(hits + 8) + (long)(local_50 * 4 + 3) * 4) +
                                     hits[2] * local_94) * 4);
                    face_nodes[1] = ref_private_macro_code_rss_8;
                    pyr_nodes[0x1a] = ref_cell_add((REF_CELL)ref_node->ref_mpi,&new_cell,&tri_face);
                    if (pyr_nodes[0x1a] != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                             ,0x2bd,"ref_validation_repair",(ulong)(uint)pyr_nodes[0x1a],"tet");
                      return pyr_nodes[0x1a];
                    }
                    pyr_nodes[0x1a] = 0;
                  }
                }
              }
              uVar2 = ref_cell_remove((REF_CELL)ref_node->old_n_global,local_94);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x2ca,"ref_validation_repair",(ulong)uVar2,"hex");
                return uVar2;
              }
            }
          }
        }
        free(_group);
        ref_grid_local._4_4_ = ref_face_free((REF_FACE)ref_cell);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x2d1,"ref_validation_repair",(ulong)ref_grid_local._4_4_,"face free");
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
           0x227,"ref_validation_repair",(ulong)(uint)ref_private_macro_code_rss_2,"face");
    ref_grid_local._4_4_ = ref_private_macro_code_rss_2;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_validation_repair(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACE ref_face;
  REF_CELL ref_cell;
  REF_INT *hits;
  REF_INT face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL report;
  REF_STATUS code;

  RSS(ref_face_create(&ref_face, ref_grid), "face");

  ref_malloc(hits, ref_face_n(ref_face), REF_INT);

  for (face = 0; face < ref_face_n(ref_face); face++) hits[face] = 0;

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, nodes, &face), "find cell face");
        hits[face]++;
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    nodes[3] = nodes[0];
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find tri");
    hits[face]++;
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    RSS(ref_face_with(ref_face, nodes, &face), "find qua");
    hits[face]++;
  }

  for (face = 0; face < ref_face_n(ref_face); face++) {
    report = REF_FALSE;
    if (ref_mpi_para(ref_grid_mpi(ref_grid))) {
      report = report || (2 < hits[face]);
      if (ref_node_owned(ref_node, ref_face_f2n(ref_face, 0, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 1, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 2, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 3, face))) {
        report = report || (2 > hits[face]);
      }
    } else {
      report = report || (2 != hits[face]);
    }
    if (report) {
      printf(" hits %d\n", hits[face]);
      for (node = 0; node < 4; node++) {
        nodes[node] = ref_face_f2n(ref_face, node, face);
      }
      printf("face %d nodes %d %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT " " REF_GLOB_FMT "\n",
             face, nodes[0], nodes[1], nodes[2], nodes[3],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]),
             ref_node_global(ref_grid_node(ref_grid), nodes[3]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[3]), "n3");
      if (nodes[0] != nodes[3]) {
        REF_INT cell0, cell1;
        REF_INT hex_nodes[REF_CELL_MAX_SIZE_PER];
        REF_GLOB global;
        REF_INT new_node, cell_node;
        ref_cell = ref_grid_hex(ref_grid);
        printf("have quad\n");
        RSS(ref_cell_with_face(ref_cell, nodes, &cell0, &cell1), "hex");
        printf("hexes %d %d\n", cell0, cell1);
        RUS(REF_EMPTY, cell0, "cant find hex");
        REIS(REF_EMPTY, cell1, "found 2 hex");
        RSS(ref_cell_nodes(ref_cell, cell0, hex_nodes), "hex");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        ref_node_xyz(ref_node, 0, new_node) = 0.0;
        ref_node_xyz(ref_node, 1, new_node) = 0.0;
        ref_node_xyz(ref_node, 2, new_node) = 0.0;
        each_ref_cell_cell_node(ref_cell, cell_node) {
          ref_node_xyz(ref_node, 0, new_node) +=
              ref_node_xyz(ref_node, 0, hex_nodes[cell_node]);
          ref_node_xyz(ref_node, 1, new_node) +=
              ref_node_xyz(ref_node, 1, hex_nodes[cell_node]);
          ref_node_xyz(ref_node, 2, new_node) +=
              ref_node_xyz(ref_node, 2, hex_nodes[cell_node]);
        }
        ref_node_xyz(ref_node, 0, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        ref_node_xyz(ref_node, 1, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        ref_node_xyz(ref_node, 2, new_node) /=
            (REF_DBL)ref_cell_node_per(ref_cell);
        each_ref_cell_cell_face(ref_cell, cell_face) {
          REF_INT face_nodes[4];
          REF_BOOL split_face;
          REF_INT new_cell;

          face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
          face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
          face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
          face_nodes[3] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
          RSS(ref_sort_same(4, nodes, face_nodes, &split_face), "same");
          if (split_face) {
            REF_INT tri_face;
            face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
            face_nodes[3] = face_nodes[0];
            if (REF_SUCCESS == ref_face_with(ref_face, face_nodes, &tri_face)) {
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
            }
            face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
            face_nodes[3] = face_nodes[0];
            if (REF_SUCCESS == ref_face_with(ref_face, face_nodes, &tri_face)) {
              face_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
              face_nodes[0] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
              face_nodes[1] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
              face_nodes[2] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
              face_nodes[3] = new_node;
              RSS(ref_cell_add(ref_grid_tet(ref_grid), face_nodes, &new_cell),
                  "tet");
            }
          } else {
            REF_INT pyr_nodes[REF_CELL_MAX_SIZE_PER];
            pyr_nodes[0] = ref_cell_f2n(ref_cell, 0, cell_face, cell0);
            pyr_nodes[3] = ref_cell_f2n(ref_cell, 1, cell_face, cell0);
            pyr_nodes[4] = ref_cell_f2n(ref_cell, 2, cell_face, cell0);
            pyr_nodes[1] = ref_cell_f2n(ref_cell, 3, cell_face, cell0);
            pyr_nodes[2] = new_node;
            RSS(ref_cell_add(ref_grid_pyr(ref_grid), pyr_nodes, &new_cell),
                "pyr");
          }
        }
        RSS(ref_cell_remove(ref_grid_hex(ref_grid), cell0), "hex");
      }
    }
  }

  free(hits);

  RSS(ref_face_free(ref_face), "face free");

  return REF_SUCCESS;
}